

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

GPU_Renderer * gpu_create_and_add_renderer(GPU_RendererID id)

{
  long lVar1;
  GPU_Renderer **ppGVar2;
  GPU_Renderer *pGVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    if (lVar4 == 0x14) {
      GPU_PushErrorCode("gpu_create_and_add_renderer",GPU_ERROR_BACKEND_ERROR,
                        "Couldn\'t create a new renderer.  Too many active renderers for GPU_MAX_ACTIVE_RENDERERS (%d)."
                        ,0x14);
      return (GPU_Renderer *)0x0;
    }
    lVar1 = lVar4 + 1;
    ppGVar2 = _gpu_renderer_map + lVar4;
    lVar4 = lVar1;
  } while (*ppGVar2 != (GPU_Renderer *)0x0);
  pGVar3 = GPU_CreateRenderer(id);
  if (pGVar3 == (GPU_Renderer *)0x0) {
    pGVar3 = (GPU_Renderer *)0x0;
    GPU_PushErrorCode("gpu_create_and_add_renderer",GPU_ERROR_BACKEND_ERROR,
                      "Failed to create new renderer.");
  }
  else {
    *(GPU_Renderer **)(&_gpu_initialized_SDL + lVar1 * 8) = pGVar3;
  }
  return pGVar3;
}

Assistant:

GPU_Renderer* gpu_create_and_add_renderer(GPU_RendererID id)
{
	int i;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] == NULL)
		{
			// Create
			GPU_Renderer* renderer = GPU_CreateRenderer(id);
			if(renderer == NULL)
            {
                GPU_PushErrorCode(__func__, GPU_ERROR_BACKEND_ERROR, "Failed to create new renderer.");
                return NULL;
            }
            
			// Add
			_gpu_renderer_map[i] = renderer;
			// Return
			return renderer;
		}
	}
	
    GPU_PushErrorCode(__func__, GPU_ERROR_BACKEND_ERROR, "Couldn't create a new renderer.  Too many active renderers for GPU_MAX_ACTIVE_RENDERERS (%d).", GPU_MAX_ACTIVE_RENDERERS);
	return NULL;
}